

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O1

REF_STATUS ref_validation_twod_orientation(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_NODE ref_node;
  bool bVar1;
  REF_STATUS RVar2;
  uint uVar3;
  int cell;
  REF_BOOL correct_orientation;
  REF_INT nodes [27];
  int local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  
  RVar2 = 0;
  if ((ref_grid->twod != 0) && (ref_cell = ref_grid->cell[3], RVar2 = 0, 0 < ref_cell->max)) {
    ref_node = ref_grid->node;
    bVar1 = true;
    cell = 0;
    do {
      RVar2 = ref_cell_nodes(ref_cell,cell,(REF_INT *)&local_a8);
      if (RVar2 == 0) {
        uVar3 = ref_node_tri_twod_orientation(ref_node,(REF_INT *)&local_a8,&local_ac);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x1fe,"ref_validation_twod_orientation",(ulong)uVar3,"valid");
          return uVar3;
        }
        if (local_ac == 0) {
          bVar1 = false;
          printf("tri %d %d %d %d\n",(ulong)local_a8,(ulong)local_a4,(ulong)local_a0,(ulong)local_9c
                );
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
    RVar2 = 0;
    if (!bVar1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x205,"ref_validation_twod_orientation","incorrect twod tri orientation");
      RVar2 = 1;
    }
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_validation_twod_orientation(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL correct_orientation, valid = REF_TRUE;

  if (!ref_grid_twod(ref_grid)) return REF_SUCCESS;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &correct_orientation),
        "valid");
    if (!correct_orientation) {
      valid = REF_FALSE;
      printf("tri %d %d %d %d\n", nodes[0], nodes[1], nodes[2], nodes[3]);
    }
  }

  RAS(valid, "incorrect twod tri orientation");

  return REF_SUCCESS;
}